

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode Curl_ossl_connect(connectdata *conn,int sockindex)

{
  _Bool local_21 [5];
  int iStack_1c;
  _Bool done;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  
  local_21[0] = false;
  iStack_1c = sockindex;
  _result = conn;
  conn_local._4_4_ = ossl_connect_common(conn,sockindex,false,local_21);
  if (conn_local._4_4_ == CURLE_OK) {
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_ossl_connect(struct connectdata *conn, int sockindex)
{
  CURLcode result;
  bool done = FALSE;

  result = ossl_connect_common(conn, sockindex, FALSE, &done);
  if(result)
    return result;

  DEBUGASSERT(done);

  return CURLE_OK;
}